

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O2

int repack_q4_0_to_q4_0_4_bl(ggml_tensor *t,int interleave_block,void *data,size_t data_size)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  ggml_half *pgVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 *puVar7;
  block_q4_0 *pbVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  uint uVar13;
  undefined8 *puVar14;
  ulong uVar15;
  undefined8 uVar16;
  int i_2;
  ggml_half (*pagVar17) [4];
  uint uVar18;
  block_q4_0 dst_tmp [4];
  block_q4_0x4 out;
  
  if (t->type == GGML_TYPE_Q4_0) {
    if ((interleave_block == 4) || (interleave_block == 8)) {
      pagVar17 = (ggml_half (*) [4])t->data;
      iVar4 = ggml_nrows(t);
      iVar5 = (int)(t->ne[0] / 0x20);
      if ((long)(iVar4 * iVar5) * 0x12 - data_size == 0) {
        if ((t->ne[0] & 7U) == 0 && (t->ne[1] & 3U) == 0) {
          uVar9 = (ulong)iVar5;
          for (iVar6 = 0; iVar6 < iVar4; iVar6 = iVar6 + 4) {
            puVar14 = (undefined8 *)data;
            for (uVar15 = 0; uVar15 != (~((long)uVar9 >> 0x3f) & uVar9); uVar15 = uVar15 + 1) {
              puVar7 = puVar14;
              for (lVar10 = 0; lVar10 != 0x48; lVar10 = lVar10 + 0x12) {
                uVar16 = *puVar7;
                uVar2 = puVar7[1];
                puVar1 = puVar7 + 2;
                puVar7 = (undefined8 *)((long)puVar7 + uVar9 * 0x12);
                *(undefined2 *)(dst_tmp[0].qs + lVar10 + 0xe) = *(undefined2 *)puVar1;
                *(undefined8 *)(dst_tmp[0].qs + lVar10 + -2) = uVar16;
                *(undefined8 *)(dst_tmp[0].qs + lVar10 + 6) = uVar2;
              }
              pbVar8 = dst_tmp;
              for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
                pgVar3 = &pbVar8->d;
                pbVar8 = pbVar8 + 1;
                out.d[lVar10] = *pgVar3;
              }
              if (interleave_block == 8) {
                uVar13 = 0;
                for (uVar11 = 0; uVar11 < 0x40 / (ulong)(uint)interleave_block; uVar11 = uVar11 + 1)
                {
                  uVar18 = uVar13 & 0xfffffff8;
                  uVar13 = uVar13 + 2;
                  *(ulong *)(out.qs + uVar11 * 8) =
                       *(ulong *)(dst_tmp[(uint)uVar11 & 3].qs + (int)uVar18) ^ 0x8888888888888888;
                }
              }
              else {
                if (interleave_block != 4) {
                  pcVar12 = "false";
                  uVar16 = 0x1635;
                  goto LAB_00112745;
                }
                for (uVar11 = 0; uVar11 < 0x40 / (ulong)(uint)interleave_block; uVar11 = uVar11 + 1)
                {
                  *(uint *)(out.qs + uVar11 * 4) =
                       *(uint *)(dst_tmp[(uint)uVar11 & 3].qs + ((uint)uVar11 & 0x7ffffffc)) ^
                       0x88888888;
                }
              }
              puVar14 = (undefined8 *)((long)puVar14 + 0x12);
              pagVar17[8] = (ggml_half  [4])out.qs._56_8_;
              *pagVar17 = out.d;
              pagVar17[1] = (ggml_half  [4])out.qs._0_8_;
              pagVar17[2] = (ggml_half  [4])out.qs._8_8_;
              pagVar17[3] = (ggml_half  [4])out.qs._16_8_;
              pagVar17[4] = (ggml_half  [4])out.qs._24_8_;
              pagVar17[5] = (ggml_half  [4])out.qs._32_8_;
              pagVar17[6] = (ggml_half  [4])out.qs._40_8_;
              pagVar17[7] = (ggml_half  [4])out.qs._48_8_;
              pagVar17 = pagVar17 + 9;
            }
            data = (void *)((long)data + (long)(iVar5 * 4) * 0x12);
          }
          iVar4 = 0;
        }
        else {
          iVar4 = -1;
        }
        return iVar4;
      }
      pcVar12 = "data_size == nrow * nblocks * sizeof(block_q4_0)";
      uVar16 = 0x16ae;
    }
    else {
      pcVar12 = "interleave_block == 4 || interleave_block == 8";
      uVar16 = 0x16a5;
    }
  }
  else {
    pcVar12 = "t->type == GGML_TYPE_Q4_0";
    uVar16 = 0x16a4;
  }
LAB_00112745:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,uVar16,"GGML_ASSERT(%s) failed",pcVar12);
}

Assistant:

static int repack_q4_0_to_q4_0_4_bl(struct ggml_tensor * t, int interleave_block, const void * GGML_RESTRICT data, size_t data_size) {
    GGML_ASSERT(t->type == GGML_TYPE_Q4_0);
    GGML_ASSERT(interleave_block == 4 || interleave_block == 8);
    constexpr int nrows_interleaved = 4;

    block_q4_0x4 * dst = (block_q4_0x4 *)t->data;
    const block_q4_0 * src = (const block_q4_0 *)data;
    block_q4_0 dst_tmp[4];
    int nrow = ggml_nrows(t);
    int nblocks = t->ne[0] / QK4_0;

    GGML_ASSERT(data_size == nrow * nblocks * sizeof(block_q4_0));

    if (t->ne[1] % nrows_interleaved != 0 || t->ne[0] % 8 != 0) {
        return -1;
    }

    for (int b = 0; b < nrow; b += nrows_interleaved) {
        for (int64_t x = 0; x < nblocks; x++) {
            for (int i = 0; i < nrows_interleaved; i++) {
                dst_tmp[i] = src[x + i * nblocks];
            }
            *dst++ = make_block_q4_0x4(dst_tmp, interleave_block);
        }
        src += nrows_interleaved * nblocks;
    }
    return 0;

    GGML_UNUSED(data_size);
}